

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.cc
# Opt level: O2

void __thiscall
CommonTest_GetOpCodeInfo_Test::CommonTest_GetOpCodeInfo_Test(CommonTest_GetOpCodeInfo_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0013ea58;
  return;
}

Assistant:

TEST(CommonTest, GetOpCodeInfo) {
  for (std::size_t i = 0; i < NUM_KINDS; ++i) {
    int opcode = INFO[i].opcode;
    if (opcode == -1) continue;
    const mp::internal::OpCodeInfo &info = mp::internal::GetOpCodeInfo(opcode);
    ex::Kind kind = INFO[i].kind != ex::BOOL ? INFO[i].kind : ex::NUMBER;
    EXPECT_EQ(kind, info.kind) << str(info.kind);
    EXPECT_EQ(INFO[i].first_kind, info.first_kind);
  }
  EXPECT_ASSERT(mp::internal::GetOpCodeInfo(-1), "invalid opcode");
  EXPECT_ASSERT(mp::internal::GetOpCodeInfo(mp::internal::MAX_OPCODE + 1),
                "invalid opcode");
}